

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall spdlog::details::full_formatter::~full_formatter(full_formatter *this)

{
  char *pcVar1;
  
  (this->cached_datetime_).super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_001eb450;
  pcVar1 = (this->cached_datetime_).super_buffer<char>.ptr_;
  if (pcVar1 != (this->cached_datetime_).store_) {
    operator_delete(pcVar1,(this->cached_datetime_).super_buffer<char>.capacity_);
  }
  operator_delete(this,0x140);
  return;
}

Assistant:

~basic_memory_buffer() FMT_OVERRIDE { deallocate(); }